

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O3

bool __thiscall
QSqlQueryModel::insertColumns(QSqlQueryModel *this,int column,int count,QModelIndex *parent)

{
  QSqlRecord *this_00;
  QVLABase<int> *this_01;
  int *piVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  ulong uVar8;
  bool bVar9;
  int c;
  long in_FS_OFFSET;
  bool bVar10;
  int nVal;
  QSqlField field;
  QString local_a8;
  QString local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < count) {
    bVar10 = false;
    if ((-1 < parent->r) && (bVar10 = false, -1 < parent->c)) {
      bVar10 = (parent->m).ptr != (QAbstractItemModel *)0x0;
    }
    bVar9 = false;
    if ((column < 0) || (bVar9 = false, bVar10)) goto LAB_0012d333;
    lVar2 = *(long *)&this->field_0x8;
    this_00 = (QSqlRecord *)(lVar2 + 0x100);
    iVar5 = QSqlRecord::count(this_00);
    if (column <= iVar5) {
      if (*(int *)(*(long *)&this->field_0x8 + 0x220) == 0) {
        QAbstractItemModel::beginInsertColumns((QModelIndex *)this,(int)parent,column);
      }
      this_01 = (QVLABase<int> *)(lVar2 + 0x128);
      iVar5 = 0;
      do {
        local_48 = 0xaaaaaaaaaaaaaaaa;
        local_68._16_8_ = 0xaaaaaaaaaaaaaaaa;
        uStack_50 = 0xaaaaaaaaaaaaaaaa;
        local_68.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
        local_68._8_8_ = 0xaaaaaaaaaaaaaaaa;
        local_88.d.size = 0;
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_a8.d.size = 0;
        local_a8.d.d = (Data *)0x0;
        local_a8.d.ptr = (char16_t *)0x0;
        QSqlField::QSqlField((QSqlField *)&local_68,&local_88,(QMetaType)0x0,&local_a8);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        QSqlField::setReadOnly((QSqlField *)&local_68,true);
        QSqlField::setGenerated((QSqlField *)&local_68,false);
        QSqlRecord::insert(this_00,column,(QSqlField *)&local_68);
        lVar3 = *(long *)(lVar2 + 0x130);
        iVar6 = QSqlRecord::count(this_00);
        if (lVar3 < iVar6) {
          lVar3 = *(long *)(lVar2 + 0x130);
          if (lVar3 == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(undefined4 *)(*(long *)(lVar2 + 0x138) + -4 + lVar3 * 4);
          }
          local_a8.d.d = (Data *)CONCAT44(local_a8.d.d._4_4_,uVar7);
          if (lVar3 == (this_01->super_QVLABaseBase).a) {
            local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,uVar7);
            QVLABase<int>::emplace_back_impl<int>
                      (this_01,0x38,(void *)(lVar2 + 0x140),(int *)&local_88);
          }
          else {
            QVLABase<int>::emplace_back_impl<int_const&>
                      (this_01,0x38,(void *)(lVar2 + 0x140),(int *)&local_a8);
          }
        }
        uVar4 = *(ulong *)(lVar2 + 0x130);
        if ((long)(ulong)(column + 1) < (long)uVar4) {
          lVar3 = *(long *)(lVar2 + 0x138);
          uVar8 = (ulong)(column + 1);
          do {
            piVar1 = (int *)(lVar3 + uVar8 * 4);
            *piVar1 = *piVar1 + 1;
            uVar8 = uVar8 + 1;
          } while (uVar4 != uVar8);
        }
        QSqlField::~QSqlField((QSqlField *)&local_68);
        iVar5 = iVar5 + 1;
      } while (iVar5 != count);
      bVar9 = true;
      if (*(int *)(*(long *)&this->field_0x8 + 0x220) == 0) {
        QAbstractItemModel::endInsertColumns();
      }
      goto LAB_0012d333;
    }
  }
  bVar9 = false;
LAB_0012d333:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQueryModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    Q_D(QSqlQueryModel);
    if (count <= 0 || parent.isValid() || column < 0 || column > d->rec.count())
        return false;

    beginInsertColumns(parent, column, column + count - 1);
    for (int c = 0; c < count; ++c) {
        QSqlField field;
        field.setReadOnly(true);
        field.setGenerated(false);
        d->rec.insert(column, field);
        if (d->colOffsets.size() < d->rec.count()) {
            int nVal = d->colOffsets.isEmpty() ? 0 : d->colOffsets[d->colOffsets.size() - 1];
            d->colOffsets.append(nVal);
            Q_ASSERT(d->colOffsets.size() >= d->rec.count());
        }
        for (qsizetype i = column + 1; i < d->colOffsets.size(); ++i)
            ++d->colOffsets[i];
    }
    endInsertColumns();
    return true;
}